

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

char fmt::v5::internal::thousands_sep<char>(locale_provider *lp)

{
  char cVar1;
  numpunct *pnVar2;
  locale loc;
  locale alStack_18 [8];
  locale local_10 [8];
  
  if (lp == (locale_provider *)0x0) {
    std::locale::locale(alStack_18);
  }
  else {
    (*lp->_vptr_locale_provider[2])(local_10,lp);
    std::locale::locale(alStack_18,local_10);
    std::locale::~locale(local_10);
  }
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>(alStack_18);
  cVar1 = (**(code **)(*(long *)pnVar2 + 0x18))(pnVar2);
  std::locale::~locale(alStack_18);
  return cVar1;
}

Assistant:

FMT_FUNC Char internal::thousands_sep(locale_provider *lp) {
  std::locale loc = lp ? lp->locale().get() : std::locale();
  return std::use_facet<std::numpunct<Char>>(loc).thousands_sep();
}